

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O0

CATNClosure * __thiscall
Centaurus::CompositeATN<wchar_t>::build_root_closure
          (CATNClosure *__return_storage_ptr__,CompositeATN<wchar_t> *this,ATNPath *path)

{
  bool bVar1;
  int iVar2;
  int index;
  int pr;
  ulong uVar3;
  size_type sVar4;
  const_reference pvVar5;
  Identifier *id;
  Identifier local_d0;
  PriorityChain local_a8;
  ATNPath local_90;
  uint local_6c;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *pvStack_68;
  uint i;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *transitions;
  CATNNode<wchar_t> *root_node;
  undefined1 local_48 [8];
  ATNStateStack stack;
  ATNPath *path_local;
  CompositeATN<wchar_t> *this_local;
  CATNClosure *closure;
  
  stack.
  super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  .
  super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  std::
  set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
  ::set(__return_storage_ptr__);
  ATNPath::ATNPath((ATNPath *)local_48);
  transitions = (vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
                 *)get_node(this,path);
  pvStack_68 = CATNNode<wchar_t>::get_transitions((CATNNode<wchar_t> *)transitions);
  local_6c = 0;
  while( true ) {
    uVar3 = (ulong)local_6c;
    sVar4 = std::
            vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
            ::size(pvStack_68);
    if (sVar4 <= uVar3) {
      stack.
      super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      .
      super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      ATNPath::~ATNPath((ATNPath *)local_48);
      if ((stack.
           super_vector<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           .
           super__Vector_base<std::pair<Centaurus::Identifier,_int>,_std::allocator<std::pair<Centaurus::Identifier,_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        std::
        set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
        ::~set(__return_storage_ptr__);
      }
      return __return_storage_ptr__;
    }
    pvVar5 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::operator[](pvStack_68,(ulong)local_6c);
    bVar1 = NFATransition<wchar_t>::is_epsilon(pvVar5);
    if (!bVar1) break;
    pvVar5 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::operator[](pvStack_68,(ulong)local_6c);
    iVar2 = NFATransition<wchar_t>::dest(pvVar5);
    ATNPath::replace_index(&local_90,path,iVar2);
    iVar2 = local_6c + 1;
    id = ATNPath::leaf_id(path);
    Identifier::Identifier(&local_d0,id);
    index = ATNPath::leaf_index(path);
    pvVar5 = std::
             vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
             ::operator[](pvStack_68,(ulong)local_6c);
    pr = NFATransition<wchar_t>::tag(pvVar5);
    PriorityChain::PriorityChain(&local_a8,&local_d0,index,pr);
    build_closure_inclusive
              (this,__return_storage_ptr__,&local_90,iVar2,(ATNStateStack *)local_48,&local_a8);
    PriorityChain::~PriorityChain(&local_a8);
    Identifier::~Identifier(&local_d0);
    ATNPath::~ATNPath(&local_90);
    local_6c = local_6c + 1;
  }
  __assert_fail("transitions[i].is_epsilon()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/src/core/CompositeATN.hpp"
                ,0x225,
                "CATNClosure Centaurus::CompositeATN<wchar_t>::build_root_closure(const ATNPath &) const [TCHAR = wchar_t]"
               );
}

Assistant:

CATNClosure build_root_closure(const ATNPath& path) const
    {
        CATNClosure closure;

        ATNStateStack stack;

        const CATNNode<TCHAR>& root_node = get_node(path);

        const std::vector<CATNTransition<TCHAR> >& transitions = root_node.get_transitions();

        for (unsigned int i = 0; i < transitions.size(); i++)
        {
            //All transitions originating from the root node must be epsilon transitions
            assert(transitions[i].is_epsilon());

            build_closure_inclusive(closure, path.replace_index(transitions[i].dest()), i + 1, stack, PriorityChain(path.leaf_id(), path.leaf_index(), transitions[i].tag()));
        }

        return closure;
    }